

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inverse_discrete_cosine_transform.cc
# Opt level: O1

bool __thiscall
sptk::InverseDiscreteCosineTransform::Run
          (InverseDiscreteCosineTransform *this,
          vector<double,_std::allocator<double>_> *real_part_input,
          vector<double,_std::allocator<double>_> *imag_part_input,
          vector<double,_std::allocator<double>_> *real_part_output,
          vector<double,_std::allocator<double>_> *imag_part_output,Buffer *buffer)

{
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  double dVar1;
  double dVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  FourierTransformInterface *pFVar7;
  char cVar8;
  int iVar9;
  double *pdVar10;
  long lVar11;
  size_t sVar12;
  double *pdVar13;
  double *pdVar14;
  size_type sVar15;
  char cVar16;
  size_type __new_size;
  bool bVar17;
  
  iVar9 = (*((this->fourier_transform_).fourier_transform_)->_vptr_FourierTransformInterface[3])();
  if (((char)iVar9 == '\0') ||
     ((long)(real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3 != (long)this->dct_length_)) {
    cVar8 = '\0';
  }
  else {
    cVar16 = '\0';
    cVar8 = '\0';
    if ((((buffer != (Buffer *)0x0) &&
         (cVar8 = cVar16, imag_part_output != (vector<double,_std::allocator<double>_> *)0x0)) &&
        (real_part_output != (vector<double,_std::allocator<double>_> *)0x0)) &&
       ((long)(imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 == (long)this->dct_length_)) {
      iVar9 = (*((this->fourier_transform_).fourier_transform_)->_vptr_FourierTransformInterface[2])
                        ();
      this_00 = &buffer->fourier_transform_real_part_;
      __new_size = (size_type)iVar9;
      if ((long)(buffer->fourier_transform_real_part_).
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(buffer->fourier_transform_real_part_).
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(this_00,__new_size);
      }
      this_01 = &buffer->fourier_transform_imag_part_;
      if ((long)(buffer->fourier_transform_imag_part_).
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish -
          (long)(buffer->fourier_transform_imag_part_).
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start >> 3 != __new_size) {
        std::vector<double,_std::allocator<double>_>::resize(this_01,__new_size);
      }
      pdVar3 = (real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar12 = (long)(real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar3;
      if (sVar12 != 0) {
        memmove((this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start,pdVar3,sVar12);
      }
      pdVar3 = (real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (real_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar5 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar11 = (long)this->dct_length_;
      pdVar13 = pdVar5 + lVar11 + 1;
      pdVar10 = pdVar13;
      while (pdVar3 = pdVar3 + 1, pdVar3 != pdVar4) {
        *pdVar10 = -*pdVar3;
        pdVar10 = pdVar10 + 1;
      }
      pdVar10 = (buffer->fourier_transform_real_part_).
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish;
      pdVar14 = pdVar10 + -1;
      if (pdVar13 < pdVar14 && pdVar13 != pdVar10) {
        pdVar10 = pdVar5 + lVar11 + 2;
        do {
          dVar1 = pdVar10[-1];
          pdVar10[-1] = *pdVar14;
          *pdVar14 = dVar1;
          pdVar14 = pdVar14 + -1;
          bVar17 = pdVar10 < pdVar14;
          pdVar10 = pdVar10 + 1;
        } while (bVar17);
      }
      pdVar5[lVar11] = 0.0;
      pdVar3 = (imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar12 = (long)(imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar3;
      if (sVar12 != 0) {
        memmove((this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start,pdVar3,sVar12);
      }
      pdVar3 = (imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (imag_part_input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pdVar5 = (this_01->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar11 = (long)this->dct_length_;
      pdVar13 = pdVar5 + lVar11 + 1;
      pdVar10 = pdVar13;
      while (pdVar3 = pdVar3 + 1, pdVar3 != pdVar4) {
        *pdVar10 = -*pdVar3;
        pdVar10 = pdVar10 + 1;
      }
      pdVar10 = (buffer->fourier_transform_imag_part_).
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish;
      pdVar14 = pdVar10 + -1;
      if (pdVar13 < pdVar14 && pdVar13 != pdVar10) {
        pdVar10 = pdVar5 + lVar11 + 2;
        do {
          dVar1 = pdVar10[-1];
          pdVar10[-1] = *pdVar14;
          *pdVar14 = dVar1;
          pdVar14 = pdVar14 + -1;
          bVar17 = pdVar10 < pdVar14;
          pdVar10 = pdVar10 + 1;
        } while (bVar17);
      }
      pdVar5[lVar11] = 0.0;
      if (0 < iVar9) {
        pdVar3 = (this->cosine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar4 = (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar6 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        sVar15 = 0;
        do {
          dVar1 = pdVar6[sVar15];
          dVar2 = pdVar5[sVar15];
          pdVar6[sVar15] = pdVar3[sVar15] * dVar1 - pdVar4[sVar15] * dVar2;
          pdVar5[sVar15] = dVar1 * pdVar4[sVar15] + dVar2 * pdVar3[sVar15];
          sVar15 = sVar15 + 1;
        } while (__new_size != sVar15);
      }
      pFVar7 = (this->fourier_transform_).fourier_transform_;
      iVar9 = (*pFVar7->_vptr_FourierTransformInterface[4])
                        (pFVar7,this_00,this_01,real_part_output,imag_part_output);
      cVar8 = (char)iVar9;
      if (cVar8 != '\0') {
        std::vector<double,_std::allocator<double>_>::resize
                  (real_part_output,(long)this->dct_length_);
        std::vector<double,_std::allocator<double>_>::resize
                  (imag_part_output,(long)this->dct_length_);
      }
    }
  }
  return (bool)cVar8;
}

Assistant:

bool InverseDiscreteCosineTransform::Run(
    const std::vector<double>& real_part_input,
    const std::vector<double>& imag_part_input,
    std::vector<double>* real_part_output,
    std::vector<double>* imag_part_output,
    InverseDiscreteCosineTransform::Buffer* buffer) const {
  // Check inputs.
  if (!fourier_transform_.IsValid() ||
      real_part_input.size() != static_cast<std::size_t>(dct_length_) ||
      imag_part_input.size() != static_cast<std::size_t>(dct_length_) ||
      NULL == real_part_output || NULL == imag_part_output || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  const int dft_length(fourier_transform_.GetLength());
  if (buffer->fourier_transform_real_part_.size() !=
      static_cast<std::size_t>(dft_length)) {
    buffer->fourier_transform_real_part_.resize(dft_length);
  }
  if (buffer->fourier_transform_imag_part_.size() !=
      static_cast<std::size_t>(dft_length)) {
    buffer->fourier_transform_imag_part_.resize(dft_length);
  }

  // Prepare real part input.
  std::copy(real_part_input.begin(), real_part_input.end(),
            buffer->fourier_transform_real_part_.begin());
  std::transform(real_part_input.begin() + 1, real_part_input.end(),
                 buffer->fourier_transform_real_part_.begin() + dct_length_ + 1,
                 std::negate<double>());
  std::reverse(buffer->fourier_transform_real_part_.begin() + dct_length_ + 1,
               buffer->fourier_transform_real_part_.end());
  buffer->fourier_transform_real_part_[dct_length_] = 0.0;

  // Prepare imaginary part input.
  std::copy(imag_part_input.begin(), imag_part_input.end(),
            buffer->fourier_transform_imag_part_.begin());
  std::transform(imag_part_input.begin() + 1, imag_part_input.end(),
                 buffer->fourier_transform_imag_part_.begin() + dct_length_ + 1,
                 std::negate<double>());
  std::reverse(buffer->fourier_transform_imag_part_.begin() + dct_length_ + 1,
               buffer->fourier_transform_imag_part_.end());
  buffer->fourier_transform_imag_part_[dct_length_] = 0.0;

  const double* cosine_table(&(cosine_table_[0]));
  const double* sine_table(&(sine_table_[0]));
  double* fourier_transform_real_part(&buffer->fourier_transform_real_part_[0]);
  double* fourier_transform_imag_part(&buffer->fourier_transform_imag_part_[0]);

  for (int i(0); i < dft_length; ++i) {
    const double temp_real_part(fourier_transform_real_part[i]);
    const double temp_imag_part(fourier_transform_imag_part[i]);
    fourier_transform_real_part[i] =
        temp_real_part * cosine_table[i] - temp_imag_part * sine_table[i];
    fourier_transform_imag_part[i] =
        temp_real_part * sine_table[i] + temp_imag_part * cosine_table[i];
  }

  if (!fourier_transform_.Run(buffer->fourier_transform_real_part_,
                              buffer->fourier_transform_imag_part_,
                              real_part_output, imag_part_output)) {
    return false;
  }

  real_part_output->resize(dct_length_);
  imag_part_output->resize(dct_length_);

  return true;
}